

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

string * cmCTestVC::ComputeCommandLine
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *cmd)

{
  pointer pbVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar4;
  ostringstream line;
  ostream oStack_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  pbVar1 = (cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pcVar3 = "";
  for (pbVar4 = (cmd->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    poVar2 = std::operator<<(&oStack_1a8,pcVar3);
    poVar2 = std::operator<<(poVar2,"\"");
    poVar2 = std::operator<<(poVar2,(string *)pbVar4);
    std::operator<<(poVar2,"\"");
    pcVar3 = " ";
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::ComputeCommandLine(const std::vector<std::string>& cmd)
{
  std::ostringstream line;
  const char* sep = "";
  for (auto const& arg : cmd) {
    line << sep << "\"" << arg << "\"";
    sep = " ";
  }
  return line.str();
}